

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu-hash32.c
# Opt level: O3

int ppc_hash32_handle_mmu_fault_ppc(PowerPCCPU_conflict *cpu,vaddr eaddr,int rwx,int mmu_idx)

{
  uint uVar1;
  int iVar2;
  hwaddr hVar3;
  ulong paddr;
  uint uVar4;
  uint uVar5;
  uint ea;
  ppc_hash_pte32_t pte;
  uint local_44;
  hwaddr local_40;
  ppc_hash_pte32_t local_38;
  
  if (2 < (uint)rwx) {
    __assert_fail("(rwx == 0) || (rwx == 1) || (rwx == 2)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/ppc/mmu-hash32.c"
                  ,0x1b4,"int ppc_hash32_handle_mmu_fault_ppc(PowerPCCPU *, vaddr, int, int)");
  }
  uVar4 = (cpu->env).msr;
  ea = (uint)eaddr;
  if (rwx == 2) {
    uVar1 = uVar4 & 0x20;
  }
  else {
    uVar1 = uVar4 & 0x10;
  }
  if (uVar1 == 0) {
    paddr = (ulong)(ea & 0xfffff000);
    uVar4 = 7;
    goto LAB_00b1f7d8;
  }
  if (((cpu->env).nb_BATs == 0) ||
     (hVar3 = ppc_hash32_bat_lookup(cpu,ea,rwx,(int *)&local_44), hVar3 == 0xffffffffffffffff)) {
    uVar1 = (cpu->env).sr[eaddr >> 0x1c];
    if (-1 < (int)uVar1) {
      if ((uVar1 >> 0x1c & 1) != 0 && rwx == 2) {
LAB_00b1f90c:
        (cpu->parent_obj).exception_index = 3;
        (cpu->env).error_code = 0x10000000;
        return 1;
      }
      hVar3 = ppc_hash32_htab_lookup(cpu,uVar1,ea,&local_38);
      if (hVar3 == 0xffffffffffffffff) {
        if (rwx == 2) {
          (cpu->parent_obj).exception_index = 3;
          (cpu->env).error_code = 0x40000000;
          return 1;
        }
        (cpu->parent_obj).exception_index = 2;
        (cpu->env).error_code = 0;
        (cpu->env).spr[0x13] = ea;
        if (rwx == 1) {
          (cpu->env).spr[0x12] = 0x42000000;
          return 1;
        }
        (cpu->env).spr[0x12] = 0x40000000;
        return 1;
      }
      uVar5 = local_38.pte1;
      if (((uint)(((cpu->env).msr & 0x4000) == 0) * 0x20000000 + 0x20000000 & uVar1) == 0) {
        uVar4 = (uint)((~uVar5 & 3) != 0) * 2 + 1;
      }
      else {
        uVar4 = *(uint *)(&DAT_00dac82c + (ulong)(uVar5 & 3) * 4);
      }
      uVar4 = uVar1 >> 0x1a & 4 | uVar4;
      if ((*(uint *)(&DAT_00db2b78 + (ulong)(uint)rwx * 4) & (uVar4 ^ 0xfffffffb)) == 0) {
        if ((uVar5 >> 8 & 1) == 0) {
          local_40 = hVar3;
          ppc_hash32_set_r(cpu,hVar3,uVar5);
          hVar3 = local_40;
        }
        uVar4 = uVar4 ^ 4;
        if (-1 < (char)local_38.pte1) {
          if (rwx == 1) {
            ppc_hash32_set_c(cpu,hVar3,(ulong)local_38 >> 0x20);
          }
          else {
            uVar4 = uVar4 & 5;
          }
        }
        paddr = (ulong)(uVar5 & 0xfffff000);
        goto LAB_00b1f7d8;
      }
      goto LAB_00b1f996;
    }
    if ((uVar1 & 0x1ff00000) == 0x7f00000) {
      local_44 = 7;
      uVar5 = ea & 0xfffffff | uVar1 << 0x1c;
      goto LAB_00b1f8a6;
    }
    if (rwx == 2) goto LAB_00b1f90c;
    iVar2 = (cpu->env).access_type;
    uVar5 = ea;
    switch(iVar2 << 0x1c | iVar2 - 0x20U >> 4) {
    case 0:
      if ((uint)(((uint)((uVar4 >> 0xe & 1) == 0) * 0x20000000 + 0x20000000 & uVar1) != 0) == rwx)
      goto LAB_00b1f8a6;
      goto LAB_00b1f99c;
    case 1:
      (cpu->parent_obj).exception_index = 5;
      (cpu->env).error_code = 1;
      (cpu->env).spr[0x13] = ea;
      break;
    case 2:
      (cpu->env).error_code = 0;
      (cpu->env).spr[0x13] = ea;
      if (rwx == 1) {
        (cpu->env).spr[0x12] = 0x6000000;
      }
      else {
        (cpu->env).spr[0x12] = 0x4000000;
      }
      break;
    case 3:
      (cpu->parent_obj).exception_index = 2;
      (cpu->env).error_code = 0;
      (cpu->env).spr[0x13] = ea;
      if (rwx == 1) {
        (cpu->env).spr[0x12] = 0x6100000;
      }
      else {
        (cpu->env).spr[0x12] = 0x4100000;
      }
      break;
    case 4:
LAB_00b1f8a6:
      paddr = (ulong)(uVar5 & 0xfffff000);
      uVar4 = local_44;
LAB_00b1f7d8:
      tlb_set_page_ppc(&cpu->parent_obj,ea & 0xfffff000,paddr,uVar4,mmu_idx,0x1000);
      return 0;
    default:
      cpu_abort_ppc(&cpu->parent_obj,"ERROR: instruction should not need address translation\n");
    }
  }
  else {
    if ((*(uint *)(&DAT_00db2b78 + (ulong)(uint)rwx * 4) & ~local_44) == 0) {
      paddr = (ulong)((uint)hVar3 & 0xfffff000);
      uVar4 = local_44;
      goto LAB_00b1f7d8;
    }
LAB_00b1f996:
    if (rwx == 2) {
      (cpu->parent_obj).exception_index = 3;
      (cpu->env).error_code = 0x8000000;
      return 1;
    }
LAB_00b1f99c:
    (cpu->parent_obj).exception_index = 2;
    (cpu->env).error_code = 0;
    (cpu->env).spr[0x13] = ea;
    if (rwx == 1) {
      (cpu->env).spr[0x12] = 0xa000000;
    }
    else {
      (cpu->env).spr[0x12] = 0x8000000;
    }
  }
  return 1;
}

Assistant:

int ppc_hash32_handle_mmu_fault(PowerPCCPU *cpu, vaddr eaddr, int rwx,
                                int mmu_idx)
{
    CPUState *cs = CPU(cpu);
    CPUPPCState *env = &cpu->env;
    target_ulong sr;
    hwaddr pte_offset;
    ppc_hash_pte32_t pte;
    int prot;
    const int need_prot[] = {PAGE_READ, PAGE_WRITE, PAGE_EXEC};
    hwaddr raddr;

    assert((rwx == 0) || (rwx == 1) || (rwx == 2));

    /* 1. Handle real mode accesses */
    if (((rwx == 2) && (msr_ir == 0)) || ((rwx != 2) && (msr_dr == 0))) {
        /* Translation is off */
        raddr = eaddr;
        tlb_set_page(cs, eaddr & TARGET_PAGE_MASK, raddr & TARGET_PAGE_MASK,
                     PAGE_READ | PAGE_WRITE | PAGE_EXEC, mmu_idx,
                     TARGET_PAGE_SIZE);
        return 0;
    }

    /* 2. Check Block Address Translation entries (BATs) */
    if (env->nb_BATs != 0) {
        raddr = ppc_hash32_bat_lookup(cpu, eaddr, rwx, &prot);
        if (raddr != -1) {
            if (need_prot[rwx] & ~prot) {
                if (rwx == 2) {
                    cs->exception_index = POWERPC_EXCP_ISI;
                    env->error_code = 0x08000000;
                } else {
                    cs->exception_index = POWERPC_EXCP_DSI;
                    env->error_code = 0;
                    env->spr[SPR_DAR] = eaddr;
                    if (rwx == 1) {
                        env->spr[SPR_DSISR] = 0x0a000000;
                    } else {
                        env->spr[SPR_DSISR] = 0x08000000;
                    }
                }
                return 1;
            }

            tlb_set_page(cs, eaddr & TARGET_PAGE_MASK,
                         raddr & TARGET_PAGE_MASK, prot, mmu_idx,
                         TARGET_PAGE_SIZE);
            return 0;
        }
    }

    /* 3. Look up the Segment Register */
    sr = env->sr[eaddr >> 28];

    /* 4. Handle direct store segments */
    if (sr & SR32_T) {
        if (ppc_hash32_direct_store(cpu, sr, eaddr, rwx,
                                    &raddr, &prot) == 0) {
            tlb_set_page(cs, eaddr & TARGET_PAGE_MASK,
                         raddr & TARGET_PAGE_MASK, prot, mmu_idx,
                         TARGET_PAGE_SIZE);
            return 0;
        } else {
            return 1;
        }
    }

    /* 5. Check for segment level no-execute violation */
    if ((rwx == 2) && (sr & SR32_NX)) {
        cs->exception_index = POWERPC_EXCP_ISI;
        env->error_code = 0x10000000;
        return 1;
    }

    /* 6. Locate the PTE in the hash table */
    pte_offset = ppc_hash32_htab_lookup(cpu, sr, eaddr, &pte);
    if (pte_offset == -1) {
        if (rwx == 2) {
            cs->exception_index = POWERPC_EXCP_ISI;
            env->error_code = 0x40000000;
        } else {
            cs->exception_index = POWERPC_EXCP_DSI;
            env->error_code = 0;
            env->spr[SPR_DAR] = eaddr;
            if (rwx == 1) {
                env->spr[SPR_DSISR] = 0x42000000;
            } else {
                env->spr[SPR_DSISR] = 0x40000000;
            }
        }

        return 1;
    }
    qemu_log_mask(CPU_LOG_MMU,
                "found PTE at offset %08" HWADDR_PRIx "\n", pte_offset);

    /* 7. Check access permissions */

    prot = ppc_hash32_pte_prot(cpu, sr, pte);

    if (need_prot[rwx] & ~prot) {
        /* Access right violation */
        qemu_log_mask(CPU_LOG_MMU, "PTE access rejected\n");
        if (rwx == 2) {
            cs->exception_index = POWERPC_EXCP_ISI;
            env->error_code = 0x08000000;
        } else {
            cs->exception_index = POWERPC_EXCP_DSI;
            env->error_code = 0;
            env->spr[SPR_DAR] = eaddr;
            if (rwx == 1) {
                env->spr[SPR_DSISR] = 0x0a000000;
            } else {
                env->spr[SPR_DSISR] = 0x08000000;
            }
        }
        return 1;
    }

    qemu_log_mask(CPU_LOG_MMU, "PTE access granted !\n");

    /* 8. Update PTE referenced and changed bits if necessary */

    if (!(pte.pte1 & HPTE32_R_R)) {
        ppc_hash32_set_r(cpu, pte_offset, pte.pte1);
    }
    if (!(pte.pte1 & HPTE32_R_C)) {
        if (rwx == 1) {
            ppc_hash32_set_c(cpu, pte_offset, pte.pte1);
        } else {
            /*
             * Treat the page as read-only for now, so that a later write
             * will pass through this function again to set the C bit
             */
            prot &= ~PAGE_WRITE;
        }
     }

    /* 9. Determine the real address from the PTE */

    raddr = ppc_hash32_pte_raddr(sr, pte, eaddr);

    tlb_set_page(cs, eaddr & TARGET_PAGE_MASK, raddr & TARGET_PAGE_MASK,
                 prot, mmu_idx, TARGET_PAGE_SIZE);

    return 0;
}